

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::iterate(IsTextureCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *log;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  GLuint textureId;
  CallLogWrapper gl;
  ResultCollector result;
  GLuint local_144;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  string local_120;
  string local_100;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  CallLogWrapper local_a0;
  ResultCollector local_88;
  code *local_38;
  GLenum local_30;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_a0,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_88,log,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_144 = 0;
  local_a0.m_enableLog = true;
  glu::CallLogWrapper::glGenTextures(&local_a0,1,&local_144);
  glu::CallLogWrapper::glBindTexture(&local_a0,this->m_target,local_144);
  GVar3 = glu::CallLogWrapper::glGetError(&local_a0);
  if (GVar3 != 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
    local_38 = glu::getErrorName;
    local_30 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_38);
    uVar8 = 0xf;
    if (local_e0 != local_d0) {
      uVar8 = local_d0[0];
    }
    if (uVar8 < local_100._M_string_length + local_d8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar9 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_100._M_string_length + local_d8) goto LAB_0186d34e;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_0186d34e:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_130 = *plVar5;
      uStack_128 = puVar4[3];
    }
    else {
      local_130 = *plVar5;
      local_140 = (long *)*puVar4;
    }
    local_138 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar6;
      local_c0 = (long *)*plVar5;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(&local_88,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  StateQueryUtil::verifyStateObjectBoolean(&local_88,&local_a0,local_144,true,QUERY_ISTEXTURE);
  glu::CallLogWrapper::glDeleteTextures(&local_a0,1,&local_144);
  GVar3 = glu::CallLogWrapper::glGetError(&local_a0);
  if (GVar3 == 0) goto LAB_0186d77f;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
  local_38 = glu::getErrorName;
  local_30 = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_38);
  uVar8 = 0xf;
  if (local_e0 != local_d0) {
    uVar8 = local_d0[0];
  }
  if (uVar8 < local_100._M_string_length + local_d8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar9 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_100._M_string_length + local_d8) goto LAB_0186d5d0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_0186d5d0:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
  }
  local_140 = &local_130;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_130 = *plVar5;
    uStack_128 = puVar4[3];
  }
  else {
    local_130 = *plVar5;
    local_140 = (long *)*puVar4;
  }
  local_138 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar5[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120.field_2._8_8_ = plVar5[3];
    local_120._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_120._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(&local_88,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
LAB_0186d77f:
  StateQueryUtil::verifyStateObjectBoolean(&local_88,&local_a0,local_144,false,QUERY_ISTEXTURE);
  tcu::ResultCollector::setTestContextResult
            (&local_88,(this->super_TestCase).super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_message._M_dataplus._M_p != &local_88.m_message.field_2) {
    operator_delete(local_88.m_message._M_dataplus._M_p,
                    local_88.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_prefix._M_dataplus._M_p != &local_88.m_prefix.field_2) {
    operator_delete(local_88.m_prefix._M_dataplus._M_p,
                    local_88.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_a0);
  return STOP;
}

Assistant:

IsTextureCase::IterateResult IsTextureCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	glw::GLuint				textureId	= 0;

	gl.enableLogging(true);

	gl.glGenTextures(1, &textureId);
	gl.glBindTexture(m_target, textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

	verifyStateObjectBoolean(result, gl, textureId, true, QUERY_ISTEXTURE);

	gl.glDeleteTextures(1, &textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");

	verifyStateObjectBoolean(result, gl, textureId, false, QUERY_ISTEXTURE);

	result.setTestContextResult(m_testCtx);
	return STOP;
}